

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O2

void kratos::MergeIfVisitor::get_targeted_if
               (StmtBlock *block,
               map<kratos::Var_*,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>_>_>_>
               *result)

{
  pointer psVar1;
  vector<std::pair<std::shared_ptr<kratos::IfStmt>,std::shared_ptr<kratos::Const>>,std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,std::shared_ptr<kratos::Const>>>>
  *this;
  pointer psVar2;
  pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_> local_a0;
  undefined1 local_80 [24];
  shared_ptr<kratos::Var> predicate;
  Var *target_var;
  undefined1 local_50 [8];
  shared_ptr<kratos::Expr> expr;
  shared_ptr<kratos::IfStmt> if_;
  
  psVar1 = (block->stmts_).
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar2 = (block->stmts_).
                super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar2 != psVar1; psVar2 = psVar2 + 1) {
    if (((psVar2->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type_ == If
       ) {
      Stmt::as<kratos::IfStmt>
                ((Stmt *)&expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
      std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)(local_80 + 0x10),
                 (__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                 (expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi + 0xc));
      if (*(int *)&(((pointer)(local_80._16_8_ + 0x168))->first)._M_dataplus._M_p == 1) {
        Var::as<kratos::Expr>((Var *)local_50);
        if (((*(_func_int **)((long)local_50 + 0x270) == (_func_int *)0x19) &&
            (*(_func_int **)((long)local_50 + 0x280) != (_func_int *)0x0)) &&
           (*(int *)(*(_func_int **)((long)local_50 + 0x280) + 0x168) == 3)) {
          predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_50 + 0x278);
          this = (vector<std::pair<std::shared_ptr<kratos::IfStmt>,std::shared_ptr<kratos::Const>>,std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,std::shared_ptr<kratos::Const>>>>
                  *)std::
                    map<kratos::Var_*,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>_>_>_>
                    ::operator[](result,(key_type *)
                                        &predicate.
                                         super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount);
          Var::as<kratos::Const>((Var *)local_80);
          std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>::
          pair<std::shared_ptr<kratos::IfStmt>_&,_std::shared_ptr<kratos::Const>,_true>
                    (&local_a0,
                     (shared_ptr<kratos::IfStmt> *)
                     &expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     (shared_ptr<kratos::Const> *)local_80);
          std::
          vector<std::pair<std::shared_ptr<kratos::IfStmt>,std::shared_ptr<kratos::Const>>,std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,std::shared_ptr<kratos::Const>>>>
          ::emplace_back<std::pair<std::shared_ptr<kratos::IfStmt>,std::shared_ptr<kratos::Const>>>
                    (this,&local_a0);
          std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>::~pair
                    (&local_a0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&expr);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&predicate);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&if_);
    }
  }
  return;
}

Assistant:

void static get_targeted_if(StmtBlock* block, std::map<Var*, std::vector<IfStmtType>>& result) {
        for (auto const& stmt : *block) {
            if (stmt->type() == StatementType::If) {
                auto if_ = stmt->as<IfStmt>();
                auto predicate = if_->predicate();
                if (predicate->type() == VarType::Expression) {
                    auto expr = predicate->as<Expr>();
                    if (expr->op == ExprOp::Eq && expr->right &&
                        expr->right->type() == VarType::ConstValue) {
                        // this is what we want
                        auto* target_var = expr->left;
                        result[target_var].emplace_back(
                            std::make_pair(if_, expr->right->as<Const>()));
                    }
                }
            }
        }
    }